

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

Am_Object * __thiscall Am_Object::operator=(Am_Object *this,Am_Object *prev)

{
  Am_Object_Data *this_00;
  Am_Object_Data *old_data;
  Am_Object *prev_local;
  Am_Object *this_local;
  
  this_00 = this->data;
  this->data = prev->data;
  if (this->data != (Am_Object_Data *)0x0) {
    Am_Wrapper::Note_Reference(&this->data->super_Am_Wrapper);
  }
  if (this_00 != (Am_Object_Data *)0x0) {
    Am_Wrapper::Release(&this_00->super_Am_Wrapper);
  }
  return this;
}

Assistant:

Am_Object &
Am_Object::operator=(const Am_Object &prev)
{
  Am_Object_Data *old_data = data;
  data = prev.data;
  if (data)
    data->Note_Reference();
  if (old_data)
    old_data->Release();
  return *this;
}